

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void softHSMLog(int loglevel,char *functionName,char *fileName,int lineNo,char *format,...)

{
  char in_AL;
  size_t sVar1;
  ostream *poVar2;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vector<char,_std::allocator<char>_> logMessage;
  va_list args;
  stringstream prepend;
  vector<char,_std::allocator<char>_> local_2b8;
  undefined1 *local_298;
  undefined1 local_288 [16];
  undefined8 local_278;
  pointer *local_270;
  undefined1 *local_268;
  stringstream local_260 [16];
  long local_250 [14];
  ios_base local_1e0 [264];
  undefined1 local_d8 [40];
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (loglevel <= softLogLevel) {
    local_b0 = in_R9;
    std::__cxx11::stringstream::stringstream(local_260);
    if (fileName == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_250 + (int)*(undefined8 *)(local_250[0] + -0x18));
    }
    else {
      sVar1 = strlen(fileName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,fileName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_250,lineNo);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,(char *)":",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250," ",1);
    local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<char,_std::allocator<char>_>::resize(&local_2b8,0x1000);
    local_268 = local_d8;
    local_270 = &logMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_278 = 0x3000000028;
    vsnprintf(local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,0x1000,format,&local_278);
    std::__cxx11::stringbuf::str();
    syslog(loglevel,"%s%s",local_298,
           local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start);
    if (local_298 != local_288) {
      operator_delete(local_298);
    }
    if (local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::__cxx11::stringstream::~stringstream(local_260);
    std::ios_base::~ios_base(local_1e0);
  }
  return;
}

Assistant:

void softHSMLog(const int loglevel, const char* functionName, const char* fileName, const int lineNo, const char* format, ...)
{
	if (loglevel > softLogLevel) return;

	std::stringstream prepend;

#ifdef SOFTHSM_LOG_FILE_AND_LINE
	prepend << fileName << "(" << lineNo << ")";
#ifndef SOFTHSM_LOG_FUNCTION_NAME
	(void) functionName;
	prepend << ":";
#endif // !SOFTHSM_LOG_FUNCTION_NAME
	prepend << " ";
#endif // SOFTHSM_LOG_FILE_AND_LINE

#ifdef SOFTHSM_LOG_FUNCTION_NAME
	prepend << functionName << ": ";
#endif // SOFTHSM_LOG_FUNCTION_NAME

	// Print the format to a log message
	std::vector<char> logMessage;
	va_list args;

	logMessage.resize(4096);

	va_start(args, format);
	vsnprintf(&logMessage[0], 4096, format, args);
	va_end(args);

	// And log it
	syslog(loglevel, "%s%s", prepend.str().c_str(), &logMessage[0]);

#ifdef DEBUG_LOG_STDERR
	fprintf(stderr, "%s%s\n", prepend.str().c_str(), &logMessage[0]);
	fflush(stderr);
#endif // DEBUG_LOG_STDERR
}